

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SegmentedMap.hpp
# Opt level: O0

mapped_type_conflict * __thiscall
binlog::detail::SegmentedMap<int>::find(SegmentedMap<int> *this,key_type *key)

{
  value_type vVar1;
  long lVar2;
  key_type __n;
  const_reference pvVar3;
  const_reference this_00;
  size_type sVar4;
  long *in_RSI;
  SegmentedMap<int> *in_RDI;
  Segment *segment;
  key_type vi;
  key_type offset;
  key_type si;
  key_type in_stack_ffffffffffffffd8;
  SegmentedMap<int> *in_stack_ffffffffffffffe0;
  const_reference local_8;
  
  __n = segmentIndex(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&in_RDI->_offsets,__n);
  vVar1 = *pvVar3;
  lVar2 = *in_RSI;
  this_00 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[](&in_RDI->_segments,__n);
  sVar4 = std::vector<int,_std::allocator<int>_>::size(this_00);
  if (lVar2 - vVar1 < sVar4) {
    local_8 = std::vector<int,_std::allocator<int>_>::operator[](this_00,lVar2 - vVar1);
  }
  else {
    local_8 = end(in_RDI);
  }
  return local_8;
}

Assistant:

const mapped_type* find(const key_type& key) const
  {
    const key_type si = segmentIndex(key);
    const key_type offset = _offsets[si];
    const key_type vi = key - offset;
    const Segment& segment = _segments[si];

    if (vi < segment.size())
    {
      return & segment[vi];
    }

    return end();
  }